

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_FloatToString.h
# Opt level: O3

void __thiscall
choc::text::FloatToStringBuffer<float>::Limits::Limits(Limits *this,MantissaAndExponent value)

{
  int iVar1;
  int iVar2;
  long lVar3;
  uint64_t uVar4;
  ulong uVar5;
  int iVar6;
  
  uVar4 = value.mantissa;
  uVar5 = uVar4 * 2 + 1;
  iVar1 = value.exponent;
  iVar6 = iVar1 + -1;
  if (((uint)value.mantissa >> 0x17 & 1) == 0) {
    lVar3 = 0x3f;
    if ((uVar5 & 0xffffff) != 0) {
      for (; ((uint)uVar5 & 0xffffff) >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    uVar5 = uVar5 << (~(byte)lVar3 + 0x19 & 0x3f);
    iVar6 = (iVar1 - ((uint)lVar3 ^ 0x3f)) + 0x26;
  }
  iVar6 = iVar6 + -0x27;
  iVar2 = iVar1 + -1;
  if (uVar4 == 0x800000) {
    iVar2 = iVar1 + -2;
  }
  lVar3 = 0x1ffffff;
  if (uVar4 != 0x800000) {
    lVar3 = uVar4 * 2 + -1;
  }
  (this->upper).mantissa = uVar5 << 0x27;
  (this->upper).exponent = iVar6;
  (this->lower).mantissa = lVar3 << ((char)iVar2 - (char)iVar6 & 0x3fU);
  (this->lower).exponent = iVar6;
  return;
}

Assistant:

constexpr Limits (MantissaAndExponent value)
        {
            upper = { (value.mantissa << 1) + 1, value.exponent - 1 };

            while ((upper.mantissa & (hiddenBit << 1)) == 0)
                upper = upper.shiftedUp (1);

            upper = upper.shiftedUp (static_cast<int> (sizeof (upper.mantissa) * 8 - numSignificandBits - 2));

            lower = value.mantissa == hiddenBit ? MantissaAndExponent { (value.mantissa << 2) - 1, value.exponent - 2 }
                                                : MantissaAndExponent { (value.mantissa << 1) - 1, value.exponent - 1 };
            lower.mantissa <<= lower.exponent - upper.exponent;
            lower.exponent = upper.exponent;
        }